

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

void MPIX_step_send(comm_pkg *comm,void *send_data,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *send_requests,char **send_buffer_ptr)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  long *in_RDI;
  ulong uVar2;
  undefined8 in_R8;
  long in_R9;
  int j;
  int i;
  int prev_ctr;
  int ctr;
  char *data;
  char *send_buffer;
  int addr;
  int type_size;
  int size;
  int end;
  int start;
  int proc;
  int idx;
  int local_70;
  int local_6c;
  int local_64;
  long local_60;
  void *local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined4 local_38;
  int local_34;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  long *local_8;
  
  local_58 = (void *)0x0;
  local_60 = in_RSI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  MPI_Type_size(in_R8,&local_48);
  if (*(int *)(*local_8 + 4) != 0) {
    MPI_Pack_size(*(undefined4 *)(*local_8 + 4),local_28,local_20,&local_44);
    uVar2 = (ulong)local_44;
    if ((long)uVar2 < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_58 = operator_new__(uVar2);
  }
  local_64 = 0;
  for (local_6c = 0; iVar1 = local_64, local_6c < *(int *)*local_8; local_6c = local_6c + 1) {
    local_38 = *(undefined4 *)(*(long *)(*local_8 + 8) + (long)local_6c * 4);
    local_40 = *(int *)(*(long *)(*local_8 + 0x10) + (long)(local_6c + 1) * 4);
    local_70 = *(int *)(*(long *)(*local_8 + 0x10) + (long)local_6c * 4);
    local_3c = local_70;
    for (; local_70 < local_40; local_70 = local_70 + 1) {
      local_34 = *(int *)(*(long *)(*local_8 + 0x18) + (long)local_70 * 4);
      MPI_Pack(local_60 + local_34 * local_48,1,local_28,local_58,local_44,&local_64,local_20);
    }
    MPI_Isend((long)local_58 + (long)iVar1,local_64 - iVar1,&ompi_mpi_packed,local_38,local_14,
              local_20,local_30 + (long)local_6c * 8);
  }
  if (local_58 != (void *)0x0) {
    *_j = local_58;
  }
  return;
}

Assistant:

static void MPIX_step_send(comm_pkg* comm, void* send_data,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* send_requests, char** send_buffer_ptr)
{
    int idx, proc, start, end;
    int size, type_size, addr;
    char* send_buffer = NULL;
    char* data = reinterpret_cast<char*>(send_data);
    MPI_Type_size(mpi_type, &type_size);
    if (comm->send_data->size_msgs)
    {
        MPI_Pack_size(comm->send_data->size_msgs, mpi_type, mpi_comm, &size);
        send_buffer = new char[size];
    }

    int ctr = 0;
    int prev_ctr = 0;
    for (int i = 0; i < comm->send_data->num_msgs; i++)
    {
        proc = comm->send_data->procs[i];
        start = comm->send_data->indptr[i];
        end = comm->send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = comm->send_data->indices[j];
            MPI_Pack(&(data[idx*type_size]), 1, mpi_type, 
                    send_buffer, size, &ctr, mpi_comm);
        }
        MPI_Isend(&send_buffer[prev_ctr], ctr - prev_ctr, MPI_PACKED, proc, tag,
                mpi_comm, &send_requests[i]);
        prev_ctr = ctr;
    }

    if (send_buffer) *send_buffer_ptr = send_buffer;
}